

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,true,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int64_t *piVar11;
  idx_t iVar12;
  long lVar13;
  ulong uVar14;
  sel_t sVar15;
  int64_t ldays;
  long lVar16;
  ulong uVar17;
  int64_t lmonths;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar12 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar12 = 0;
    uVar5 = 0;
    uVar8 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar4 = puVar1[uVar5];
      }
      uVar10 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar10 = count;
      }
      uVar17 = uVar10;
      if (uVar4 != 0) {
        uVar17 = uVar8;
        if (uVar4 == 0xffffffffffffffff) {
          if (uVar8 < uVar10) {
            lVar13 = ldata->micros;
            psVar2 = sel->sel_vector;
            lVar6 = (long)ldata->days + lVar13 / 86400000000;
            lVar16 = lVar6 % 0x1e;
            lVar6 = (long)ldata->months + lVar6 / 0x1e;
            psVar3 = true_sel->sel_vector;
            piVar11 = &rdata[uVar8].micros;
            do {
              uVar8 = uVar17;
              if (psVar2 != (sel_t *)0x0) {
                uVar8 = (ulong)psVar2[uVar17];
              }
              lVar7 = (long)*(int32_t *)((long)piVar11 + -4) + *piVar11 / 86400000000;
              lVar9 = lVar7 % 0x1e;
              lVar7 = (long)((interval_t *)(piVar11 + -1))->months + lVar7 / 0x1e;
              uVar4 = 1;
              if (lVar6 <= lVar7) {
                if (lVar6 < lVar7) {
                  uVar4 = 0;
                }
                else if (lVar16 <= lVar9) {
                  uVar4 = (ulong)(*piVar11 % 86400000000 < lVar13 % 86400000000 && lVar9 <= lVar16);
                }
              }
              psVar3[iVar12] = (sel_t)uVar8;
              iVar12 = iVar12 + uVar4;
              uVar17 = uVar17 + 1;
              piVar11 = piVar11 + 2;
            } while (uVar10 != uVar17);
          }
        }
        else if (uVar8 < uVar10) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          piVar11 = &rdata[uVar8].micros;
          uVar17 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar15 = (int)uVar8 + (int)uVar17;
            }
            else {
              sVar15 = psVar2[uVar8 + uVar17];
            }
            if ((uVar4 >> (uVar17 & 0x3f) & 1) == 0) {
              uVar14 = 0;
            }
            else {
              lVar13 = (long)ldata->days + ldata->micros / 86400000000;
              lVar7 = lVar13 % 0x1e;
              lVar6 = (long)ldata->months + lVar13 / 0x1e;
              lVar16 = (long)*(int32_t *)((long)piVar11 + -4) + *piVar11 / 86400000000;
              lVar13 = lVar16 % 0x1e;
              lVar16 = (long)((interval_t *)(piVar11 + -1))->months + lVar16 / 0x1e;
              uVar14 = 1;
              if (lVar6 <= lVar16) {
                if (lVar6 < lVar16) {
                  uVar14 = 0;
                }
                else if (lVar7 <= lVar13) {
                  uVar14 = (ulong)(*piVar11 % 86400000000 < ldata->micros % 86400000000 &&
                                  lVar13 <= lVar7);
                }
              }
            }
            psVar3[iVar12] = sVar15;
            iVar12 = uVar14 + iVar12;
            uVar17 = uVar17 + 1;
            piVar11 = piVar11 + 2;
          } while ((uVar8 - uVar10) + uVar17 != 0);
          uVar17 = uVar8 + uVar17;
        }
      }
      uVar5 = uVar5 + 1;
      uVar8 = uVar17;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}